

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O3

UBool anon_unknown.dwarf_36d838::characterproperties_cleanup(void)

{
  UnicodeSet *pUVar1;
  void *in_RSI;
  long lVar2;
  
  lVar2 = 0;
  do {
    pUVar1 = *(UnicodeSet **)((long)&(anonymous_namespace)::gInclusions + lVar2);
    if (pUVar1 != (UnicodeSet *)0x0) {
      icu_63::UnicodeSet::~UnicodeSet(pUVar1);
    }
    icu_63::UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
    *(undefined8 *)((long)&(anonymous_namespace)::gInclusions + lVar2) = 0;
    LOCK();
    *(undefined4 *)((long)&DAT_003ed768 + lVar2) = 0;
    UNLOCK();
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xf0);
  lVar2 = 0;
  do {
    pUVar1 = *(UnicodeSet **)((long)&(anonymous_namespace)::sets + lVar2);
    if (pUVar1 != (UnicodeSet *)0x0) {
      icu_63::UnicodeSet::~UnicodeSet(pUVar1);
    }
    icu_63::UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
    *(undefined8 *)((long)&(anonymous_namespace)::sets + lVar2) = 0;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x208);
  lVar2 = 0;
  do {
    ucptrie_close_63(*(UCPTrie **)((long)&(anonymous_namespace)::maps + lVar2));
    *(undefined8 *)((long)&(anonymous_namespace)::maps + lVar2) = 0;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 200);
  return '\x01';
}

Assistant:

UBool U_CALLCONV characterproperties_cleanup() {
    for (Inclusion &in: gInclusions) {
        delete in.fSet;
        in.fSet = nullptr;
        in.fInitOnce.reset();
    }
    for (int32_t i = 0; i < UPRV_LENGTHOF(sets); ++i) {
        delete sets[i];
        sets[i] = nullptr;
    }
    for (int32_t i = 0; i < UPRV_LENGTHOF(maps); ++i) {
        ucptrie_close(reinterpret_cast<UCPTrie *>(maps[i]));
        maps[i] = nullptr;
    }
    return TRUE;
}